

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# num_parse_test.cpp
# Opt level: O0

void __thiscall
num_parse_test_parse_unsigned_Test::num_parse_test_parse_unsigned_Test
          (num_parse_test_parse_unsigned_Test *this)

{
  num_parse_test_parse_unsigned_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__num_parse_test_parse_unsigned_Test_002007c0;
  return;
}

Assistant:

TEST(num_parse_test, parse_unsigned) {
  uint32_t expected32 = 0xcafebabe;
  auto res32 = parse<uint32_t, sizeof(uint32_t), default_endian_type>(
      reinterpret_cast<uint8_t const *>(&expected32));
  EXPECT_EQ(res32, expected32);

  uint16_t expected16 = 0xcafe;
  auto res16 = parse<uint16_t, sizeof(uint16_t), default_endian_type>(
      reinterpret_cast<uint8_t const *>(&expected16));
  EXPECT_EQ(res16, expected16);

  uint8_t expected8 = 0xfe;
  auto res8 = parse<uint8_t, sizeof(uint8_t), default_endian_type>(
      reinterpret_cast<uint8_t const *>(&expected8));
  EXPECT_EQ(res8, expected8);
}